

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O1

int Msat_ClausePropagate(Msat_Clause_t *pC,Msat_Lit_t Lit,int *pAssigns,Msat_Lit_t *pLit_out)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  uVar4 = Lit ^ 1;
  if (pC[1].Num == uVar4) {
    pC[1].Num = *(int *)&pC[1].field_0x4;
    *(uint *)&pC[1].field_0x4 = uVar4;
  }
  if (*(uint *)&pC[1].field_0x4 != uVar4) {
    __assert_fail("pC->pData[1] == LitF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatClause.c"
                  ,0x155,
                  "int Msat_ClausePropagate(Msat_Clause_t *, Msat_Lit_t, int *, Msat_Lit_t *)");
  }
  iVar2 = 1;
  if (pAssigns[pC[1].Num >> 1] != pC[1].Num) {
    if ((0x10 < (*(uint *)&pC->field_0x4 & 0x1fff8)) &&
       (uVar3 = *(uint *)&pC->field_0x4 >> 3 & 0x3fff, 2 < uVar3)) {
      lVar5 = 0;
      do {
        uVar1 = (&pC[2].Num)[lVar5];
        if ((pAssigns[(int)uVar1 >> 1] ^ uVar1) != 1) {
          *(uint *)&pC[1].field_0x4 = uVar1;
          (&pC[2].Num)[lVar5] = uVar4;
          uVar4 = *(uint *)&pC[1].field_0x4 ^ 1;
          iVar2 = 1;
          goto LAB_0092a7fc;
        }
        lVar5 = lVar5 + 1;
      } while ((ulong)uVar3 - 2 != lVar5);
    }
    uVar4 = pC[1].Num;
    iVar2 = 0;
LAB_0092a7fc:
    *pLit_out = uVar4;
  }
  return iVar2;
}

Assistant:

int  Msat_ClausePropagate( Msat_Clause_t * pC, Msat_Lit_t Lit, int * pAssigns, Msat_Lit_t * pLit_out )
{
    // make sure the false literal is pC->pData[1]
    Msat_Lit_t LitF = MSAT_LITNOT(Lit);
    if ( pC->pData[0] == LitF )
         pC->pData[0] = pC->pData[1], pC->pData[1] = LitF;
    assert( pC->pData[1] == LitF );
    // if the 0-th watch is true, clause is already satisfied
    if ( pAssigns[MSAT_LIT2VAR(pC->pData[0])] == pC->pData[0] )
        return 1; 
    // look for a new watch
    if ( pC->nSize > 2 )
    {
        int i;
        for ( i = 2; i < (int)pC->nSize; i++ )
            if ( pAssigns[MSAT_LIT2VAR(pC->pData[i])] != MSAT_LITNOT(pC->pData[i]) )
            {
                pC->pData[1] = pC->pData[i], pC->pData[i] = LitF;
                *pLit_out = MSAT_LITNOT(pC->pData[1]);
                return 1; 
            }
    }
    // clause is unit under assignment
    *pLit_out = pC->pData[0];
    return 0;
}